

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPExternalTransmitter::DeleteTransmissionInfo
          (RTPExternalTransmitter *this,RTPTransmissionInfo *i)

{
  if (this->init == true) {
    RTPDelete<jrtplib::RTPTransmissionInfo>
              (i,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
    return;
  }
  return;
}

Assistant:

void RTPExternalTransmitter::DeleteTransmissionInfo(RTPTransmissionInfo *i)
{
	if (!init)
		return;

	RTPDelete(i, GetMemoryManager());
}